

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

FxExpression * __thiscall FxIfStatement::Resolve(FxIfStatement *this,FCompileContext *ctx)

{
  FxExpression **ppFVar1;
  BYTE BVar2;
  PString *pPVar3;
  int iVar4;
  FxExpression *pFVar5;
  undefined4 extraout_var;
  FxBoolCast *this_00;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  FxIfStatement *pFVar6;
  FScriptPosition *pFVar7;
  FxIfStatement *pFVar8;
  bool bVar9;
  ExpVal condval;
  FString local_30;
  
  if ((this->super_FxExpression).isresolved != false) {
    return &this->super_FxExpression;
  }
  (this->super_FxExpression).isresolved = true;
  if (this->WhenFalse == (FxExpression *)0x0 && this->WhenTrue == (FxExpression *)0x0) {
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    pFVar7 = &(this->super_FxExpression).ScriptPosition;
    FScriptPosition::Message(pFVar7,0,"empty if statement");
    pFVar5 = (FxExpression *)FMemArena::Alloc(&FxAlloc,0x28);
    pFVar5->_vptr_FxExpression = (_func_int **)&PTR__FxExpression_00711370;
    FScriptPosition::FScriptPosition(&pFVar5->ScriptPosition,pFVar7);
    pFVar5->ValueType = (PType *)0x0;
    pFVar5->ExprType = EFX_Nop;
    pFVar5->_vptr_FxExpression = (_func_int **)&PTR__FxExpression_00711e78;
    pFVar5->isresolved = true;
    pFVar5->NeedResult = true;
    return pFVar5;
  }
  pFVar5 = this->Condition;
  if (pFVar5 != (FxExpression *)0x0) {
    iVar4 = (*pFVar5->_vptr_FxExpression[2])(pFVar5,ctx);
    this->Condition = (FxExpression *)CONCAT44(extraout_var,iVar4);
  }
  if (this->Condition == (FxExpression *)0x0) {
LAB_0053a296:
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    this = (FxIfStatement *)0x0;
  }
  else {
    if (this->Condition->ValueType != (PType *)TypeBool) {
      this_00 = (FxBoolCast *)FMemArena::Alloc(&FxAlloc,0x38);
      pFVar5 = this->Condition;
      (this_00->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_00711370;
      FScriptPosition::FScriptPosition
                (&(this_00->super_FxExpression).ScriptPosition,&pFVar5->ScriptPosition);
      (this_00->super_FxExpression).ValueType = (PType *)0x0;
      (this_00->super_FxExpression).isresolved = false;
      (this_00->super_FxExpression).NeedResult = true;
      (this_00->super_FxExpression).ExprType = EFX_BoolCast;
      (this_00->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxBoolCast_0070f548;
      this_00->basex = pFVar5;
      (this_00->super_FxExpression).ValueType = (PType *)TypeBool;
      this_00->NeedValue = false;
      this->Condition = (FxExpression *)this_00;
      pFVar5 = FxBoolCast::Resolve(this_00,ctx);
      this->Condition = pFVar5;
      if (pFVar5 == (FxExpression *)0x0) goto LAB_0053a296;
    }
    ppFVar1 = &this->WhenTrue;
    pFVar5 = *ppFVar1;
    if (pFVar5 != (FxExpression *)0x0) {
      iVar4 = (*pFVar5->_vptr_FxExpression[2])(pFVar5,ctx);
      *ppFVar1 = (FxExpression *)CONCAT44(extraout_var_00,iVar4);
      if ((FxExpression *)CONCAT44(extraout_var_00,iVar4) == (FxExpression *)0x0) goto LAB_0053a296;
    }
    pFVar5 = this->WhenFalse;
    if (pFVar5 != (FxExpression *)0x0) {
      iVar4 = (*pFVar5->_vptr_FxExpression[2])(pFVar5,ctx);
      this->WhenFalse = (FxExpression *)CONCAT44(extraout_var_01,iVar4);
      if ((FxExpression *)CONCAT44(extraout_var_01,iVar4) == (FxExpression *)0x0) goto LAB_0053a296;
    }
    (this->super_FxExpression).ValueType = &TypeVoid->super_PType;
    iVar4 = (*this->Condition->_vptr_FxExpression[3])();
    if ((char)iVar4 != '\0') {
      pPVar3 = (PString *)this->Condition[1]._vptr_FxExpression;
      pFVar7 = &this->Condition[1].ScriptPosition;
      if (pPVar3 == TypeString) {
        FString::AttachToOther(&local_30,&pFVar7->FileName);
      }
      else {
        local_30.Chars = (pFVar7->FileName).Chars;
      }
      BVar2 = (pPVar3->super_PBasicType).super_PType.RegType;
      if (BVar2 == '\x01') {
        bVar9 = (double)local_30.Chars != 0.0;
      }
      else if (BVar2 == '\0') {
        bVar9 = (int)local_30.Chars != 0;
      }
      else {
        bVar9 = false;
      }
      pFVar8 = (FxIfStatement *)this->WhenTrue;
      pFVar6 = (FxIfStatement *)this->WhenFalse;
      if (bVar9) {
        pFVar8 = (FxIfStatement *)this->WhenFalse;
        pFVar6 = (FxIfStatement *)this->WhenTrue;
      }
      if (pFVar8 != (FxIfStatement *)0x0) {
        (*(pFVar8->super_FxExpression)._vptr_FxExpression[1])();
      }
      *ppFVar1 = (FxExpression *)0x0;
      this->WhenFalse = (FxExpression *)0x0;
      if (pFVar6 == (FxIfStatement *)0x0) {
        pFVar6 = (FxIfStatement *)FMemArena::Alloc(&FxAlloc,0x28);
        (pFVar6->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_00711370;
        FScriptPosition::FScriptPosition
                  (&(pFVar6->super_FxExpression).ScriptPosition,
                   &(this->super_FxExpression).ScriptPosition);
        (pFVar6->super_FxExpression).ValueType = (PType *)0x0;
        (pFVar6->super_FxExpression).ExprType = EFX_Nop;
        (pFVar6->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_00711e78;
        (pFVar6->super_FxExpression).isresolved = true;
        (pFVar6->super_FxExpression).NeedResult = true;
      }
      (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
      this = pFVar6;
      if (pPVar3 == TypeString) {
        FString::~FString(&local_30);
      }
    }
  }
  return &this->super_FxExpression;
}

Assistant:

FxExpression *FxIfStatement::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();

	if (WhenTrue == nullptr && WhenFalse == nullptr)
	{ // We don't do anything either way, so disappear
		delete this;
		ScriptPosition.Message(MSG_WARNING, "empty if statement");
		return new FxNop(ScriptPosition);
	}

	SAFE_RESOLVE(Condition, ctx);

	if (Condition->ValueType != TypeBool)
	{
		Condition = new FxBoolCast(Condition, false);
		SAFE_RESOLVE(Condition, ctx);
	}

	if (WhenTrue != nullptr)
	{
		WhenTrue = WhenTrue->Resolve(ctx);
		ABORT(WhenTrue);
	}
	if (WhenFalse != nullptr)
	{
		WhenFalse = WhenFalse->Resolve(ctx);
		ABORT(WhenFalse);
	}

	ValueType = TypeVoid;

	if (Condition->isConstant())
	{
		ExpVal condval = static_cast<FxConstant *>(Condition)->GetValue();
		bool result = condval.GetBool();

		FxExpression *e = result ? WhenTrue : WhenFalse;
		delete (result ? WhenFalse : WhenTrue);
		WhenTrue = WhenFalse = nullptr;
		if (e == nullptr) e = new FxNop(ScriptPosition);	// create a dummy if this statement gets completely removed by optimizing out the constant parts.
		delete this;
		return e;
	}

	return this;
}